

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O0

int ed25519_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  size_t sVar2;
  uint8_t *in;
  undefined1 local_38 [8];
  CBS inner;
  CBS *key_local;
  CBS *params_local;
  EVP_PKEY *out_local;
  
  inner.len = (size_t)key;
  sVar2 = CBS_len(params);
  if (((sVar2 == 0) && (iVar1 = CBS_get_asn1((CBS *)inner.len,(CBS *)local_38,4), iVar1 != 0)) &&
     (sVar2 = CBS_len((CBS *)inner.len), sVar2 == 0)) {
    in = CBS_data((CBS *)local_38);
    sVar2 = CBS_len((CBS *)local_38);
    iVar1 = ed25519_set_priv_raw(out,in,sVar2);
    return iVar1;
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                ,0xa4);
  return 0;
}

Assistant:

static int ed25519_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 8410, section 7.

  // Parameters must be empty. The key is a 32-byte value wrapped in an extra
  // OCTET STRING layer.
  CBS inner;
  if (CBS_len(params) != 0 ||
      !CBS_get_asn1(key, &inner, CBS_ASN1_OCTETSTRING) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  return ed25519_set_priv_raw(out, CBS_data(&inner), CBS_len(&inner));
}